

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_add_checked(roaring_bitmap_t *r,uint32_t val)

{
  uint8_t typecode;
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  char cVar5;
  int32_t iVar6;
  int iVar7;
  undefined8 in_RAX;
  shared_container_t *sc;
  run_container_t *prVar8;
  array_container_t *c;
  container_t *c_00;
  void **ppvVar9;
  ushort key;
  uint uVar10;
  uint uVar11;
  run_container_t *run;
  uint8_t newtypecode;
  undefined8 uStack_38;
  
  iVar7 = (r->high_low_container).size;
  key = (ushort)(val >> 0x10);
  uStack_38 = in_RAX;
  if (((long)iVar7 == 0) || (puVar2 = (r->high_low_container).keys, puVar2[(long)iVar7 + -1] == key)
     ) {
    uVar10 = iVar7 - 1;
  }
  else {
    if (iVar7 < 1) {
      uVar10 = 0xffffffff;
      goto LAB_00104f59;
    }
    iVar7 = iVar7 + -1;
    uVar11 = 0;
    do {
      uVar10 = iVar7 + uVar11 >> 1;
      uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar7 + uVar11 & 0xfffffffe));
      if (uVar1 < key) {
        uVar11 = uVar10 + 1;
      }
      else {
        if (uVar1 <= key) goto LAB_00104e3e;
        iVar7 = uVar10 - 1;
      }
    } while ((int)uVar11 <= iVar7);
    uVar10 = ~uVar11;
  }
  if (-1 < (int)uVar10) {
LAB_00104e3e:
    ppvVar9 = (r->high_low_container).containers;
    puVar3 = (r->high_low_container).typecodes;
    uVar11 = uVar10 & 0xffff;
    sc = (shared_container_t *)ppvVar9[uVar11];
    if (puVar3[uVar11] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar11);
      ppvVar9 = (r->high_low_container).containers;
    }
    *(shared_container_t **)((long)ppvVar9 + (ulong)(uVar11 * 8)) = sc;
    typecode = (r->high_low_container).typecodes[uVar11];
    run = *(run_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar11 * 8));
    prVar8 = run;
    uVar4 = typecode;
    if (typecode == '\x04') {
      uVar4 = *(uint8_t *)&run->runs;
      prVar8 = *(run_container_t **)run;
    }
    if (uVar4 == '\x03') {
      iVar6 = run_container_cardinality(prVar8);
    }
    else {
      iVar6 = prVar8->n_runs;
    }
    uStack_38._0_7_ = CONCAT16(typecode,(undefined6)uStack_38);
    prVar8 = (run_container_t *)
             container_add(run,(uint16_t)val,typecode,(uint8_t *)((long)&uStack_38 + 6));
    if (prVar8 != run) {
      container_free(run,typecode);
      (r->high_low_container).containers[uVar10] = prVar8;
      (r->high_low_container).typecodes[uVar10] = uStack_38._6_1_;
      return true;
    }
    cVar5 = uStack_38._6_1_;
    if (uStack_38._6_1_ == '\x04') {
      cVar5 = *(char *)&run->runs;
      run = *(run_container_t **)run;
    }
    if (cVar5 == '\x03') {
      iVar7 = run_container_cardinality(run);
    }
    else {
      iVar7 = run->n_runs;
    }
    return iVar6 != iVar7;
  }
LAB_00104f59:
  c = array_container_create();
  c_00 = container_add(c,(uint16_t)val,'\x02',(uint8_t *)((long)&uStack_38 + 7));
  ra_insert_new_key_value_at(&r->high_low_container,~uVar10,key,c_00,uStack_38._7_1_);
  return true;
}

Assistant:

bool roaring_bitmap_add_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, (uint16_t)i);
        container_t *container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_add(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
            result = true;
        } else {
            const int newCardinality =
                container_get_cardinality(container, newtypecode);

            result = oldCardinality != newCardinality;
        }
    } else {
        array_container_t *newac = array_container_create();
        container_t *container =
            container_add(newac, val & 0xFFFF, ARRAY_CONTAINER_TYPE, &typecode);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(&r->high_low_container, -i - 1, hb,
                                   container, typecode);
        result = true;
    }

    return result;
}